

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollectionCase::UniformCollectionCase
          (UniformCollectionCase *this,char *name,UniformCollection *uniformCollection_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  SharedPtrStateBase *pSVar4;
  size_type *psVar5;
  long *local_40 [2];
  long local_30 [2];
  
  if (name == (char *)0x0) {
    (this->namePrefix)._M_dataplus._M_p = (pointer)&(this->namePrefix).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)this,0x1b3c1e9);
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"_","");
    strlen(name);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,(ulong)name);
    paVar1 = &(this->namePrefix).field_2;
    (this->namePrefix)._M_dataplus._M_p = (pointer)paVar1;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar2 = plVar3[3];
      paVar1->_M_allocated_capacity = *psVar5;
      *(long *)((long)&(this->namePrefix).field_2 + 8) = lVar2;
    }
    else {
      (this->namePrefix)._M_dataplus._M_p = (pointer)*plVar3;
      (this->namePrefix).field_2._M_allocated_capacity = *psVar5;
    }
    (this->namePrefix)._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  if ((name != (char *)0x0) && (local_40[0] != local_30)) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  (this->uniformCollection).m_ptr = (UniformCollection *)0x0;
  (this->uniformCollection).m_state = (SharedPtrStateBase *)0x0;
  (this->uniformCollection).m_ptr = uniformCollection_;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021747e8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)uniformCollection_;
  (this->uniformCollection).m_state = pSVar4;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  return;
}

Assistant:

UniformCollectionCase (const char* const name, const UniformCollection* uniformCollection_)
		: namePrefix			(name ? name + string("_") : "")
		, uniformCollection		(uniformCollection_)
	{
	}